

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf-c.cc
# Opt level: O3

QPDFObjectHandle qpdf_oh_item_internal(qpdf_data qpdf,qpdf_oh item)

{
  size_t *psVar1;
  undefined1 this [8];
  uint uVar2;
  _Node *p_Var3;
  char *cstr;
  Pipeline *this_00;
  undefined4 in_EDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_03;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_04;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_05;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_06;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_07;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined4 in_register_00000034;
  qpdf_data qpdf_00;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> _Var5;
  undefined1 local_140 [8];
  undefined1 local_138 [24];
  _Invoker_type p_Stack_120;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_118;
  _Any_data local_108;
  code *local_f8;
  code *local_f0;
  undefined1 local_e8 [40];
  Pipeline *local_c0;
  undefined8 uStack_b8;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  element_type *local_38;
  code *local_30;
  
  qpdf_00 = (qpdf_data)CONCAT44(in_register_00000034,item);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<QPDFObjectHandle_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1593:9)>
             ::_M_invoke;
  local_38 = (element_type *)
             std::
             _Function_handler<QPDFObjectHandle_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1593:9)>
             ::_M_manager;
  local_108._M_unused._M_object = (void *)0x0;
  local_108._8_8_ = 0;
  local_f0 = std::
             _Function_handler<QPDFObjectHandle_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1594:9)>
             ::_M_invoke;
  local_f8 = std::
             _Function_handler<QPDFObjectHandle_(QPDFObjectHandle_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:1594:9)>
             ::_M_manager;
  std::function<QPDFObjectHandle_()>::function
            ((function<QPDFObjectHandle_()> *)&local_68,(function<QPDFObjectHandle_()> *)&local_48);
  std::function<QPDFObjectHandle_(QPDFObjectHandle_&)>::function
            ((function<QPDFObjectHandle_(QPDFObjectHandle_&)> *)(local_e8 + 0x18),
             (function<QPDFObjectHandle_(QPDFObjectHandle_&)> *)&local_108);
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_a8._M_unused._M_object = operator_new(0x28);
  *(undefined8 *)local_a8._M_unused._0_8_ = 0;
  *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)local_a8._M_unused._0_8_ + 0x18) = uStack_b8;
  if (local_c0 != (Pipeline *)0x0) {
    *(undefined8 *)local_a8._M_unused._0_8_ = local_e8._24_8_;
    *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) = local_e8._32_8_;
    *(Pipeline **)((long)local_a8._M_unused._0_8_ + 0x10) = local_c0;
    local_c0 = (Pipeline *)0x0;
    uStack_b8 = 0;
  }
  *(undefined4 *)((long)local_a8._M_unused._0_8_ + 0x20) = in_EDX;
  pcStack_90 = std::
               _Function_handler<QPDFObjectHandle_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
               ::_M_invoke;
  local_98 = std::
             _Function_handler<QPDFObjectHandle_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:919:48)>
             ::_M_manager;
  local_140 = (undefined1  [8])local_e8;
  local_e8._0_8_ = (element_type *)0x0;
  local_e8._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::function<QPDFObjectHandle_(_qpdf_data_*)>::function
            ((function<QPDFObjectHandle_(_qpdf_data_*)> *)local_138,
             (function<QPDFObjectHandle_(_qpdf_data_*)> *)&local_a8);
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_88._M_unused._M_object = operator_new(0x28);
  *(undefined1 (*) [8])local_88._M_unused._0_8_ = local_140;
  *(long *)((long)local_88._M_unused._0_8_ + 8) = 0;
  *(long *)((long)local_88._M_unused._0_8_ + 0x10) = 0;
  *(long *)((long)local_88._M_unused._0_8_ + 0x18) = 0;
  *(_Invoker_type *)((long)local_88._M_unused._0_8_ + 0x20) = p_Stack_120;
  if ((_Manager_type)local_138._16_8_ != (_Manager_type)0x0) {
    *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) = local_138._0_8_;
    *(undefined8 *)((long)local_88._M_unused._0_8_ + 0x10) = local_138._8_8_;
    *(undefined8 *)((long)local_88._M_unused._0_8_ + 0x18) = local_138._16_8_;
    local_138._16_8_ = (_Manager_type)0x0;
    p_Stack_120 = (_Invoker_type)0x0;
  }
  pcStack_70 = std::
               _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
               ::_M_invoke;
  local_78 = std::
             _Function_handler<void_(_qpdf_data_*),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/qpdf-c.cc:811:48)>
             ::_M_manager;
  uVar2 = trap_errors(qpdf_00,(function<void_(_qpdf_data_*)> *)&local_88);
  _Var4._M_pi = extraout_RDX;
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
    _Var4._M_pi = extraout_RDX_00;
  }
  if ((_Manager_type)local_138._16_8_ != (_Manager_type)0x0) {
    (*(code *)local_138._16_8_)
              ((function<QPDFObjectHandle_(_qpdf_data_*)> *)local_138,
               (function<QPDFObjectHandle_(_qpdf_data_*)> *)local_138,3);
    _Var4._M_pi = extraout_RDX_01;
  }
  if (uVar2 < 2) {
    (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)local_e8._0_8_;
    (qpdf->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_;
  }
  else {
    if (qpdf_00->silence_errors == false) {
      if (qpdf_00->oh_error_occurred == false) {
        local_118._M_allocated_capacity._0_4_ = 1;
        QPDF::getFilename_abi_cxx11_
                  ((string *)local_140,
                   (qpdf_00->qpdf).super___shared_ptr<QPDF,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_e8._20_4_ = 0;
        p_Var3 = std::__cxx11::list<QPDFExc,std::allocator<QPDFExc>>::
                 _M_create_node<qpdf_error_code_e,std::__cxx11::string,char_const(&)[1],int,char_const(&)[129]>
                           ((list<QPDFExc,std::allocator<QPDFExc>> *)&qpdf_00->warnings,
                            (qpdf_error_code_e *)&local_118._M_allocated_capacity,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_140,(char (*) [1])0x27cec8,(int *)(local_e8 + 0x14),
                            (char (*) [129])
                            "C API function caught an exception that it isn\'t returning; please point the application developer to ERROR HANDLING in qpdf-c.h"
                           );
        std::__detail::_List_node_base::_M_hook(&p_Var3->super__List_node_base);
        psVar1 = &(qpdf_00->warnings).super__List_base<QPDFExc,_std::allocator<QPDFExc>_>._M_impl.
                  _M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (local_140 != (undefined1  [8])(local_138 + 8)) {
          operator_delete((void *)local_140,local_138._8_8_ + 1);
        }
        qpdf_00->oh_error_occurred = true;
      }
      QPDFLogger::defaultLogger();
      QPDFLogger::getError((QPDFLogger *)local_140,SUB41(local_118._M_allocated_capacity._0_4_,0));
      this = local_140;
      cstr = (char *)(**(code **)(*(long *)(qpdf_00->error).
                                           super___shared_ptr<QPDFExc,_(__gnu_cxx::_Lock_policy)2>.
                                           _M_ptr + 0x10))();
      this_00 = Pipeline::operator<<((Pipeline *)this,cstr);
      Pipeline::operator<<(this_00,"\n");
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._0_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_138._0_8_);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_118._8_8_);
      }
    }
    if (local_58 == (code *)0x0) {
      std::__throw_bad_function_call();
    }
    (*local_50)((_Any_data *)qpdf);
    _Var4._M_pi = extraout_RDX_02;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_e8._8_8_);
      _Var4._M_pi = extraout_RDX_03;
    }
  }
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
    _Var4._M_pi = extraout_RDX_04;
  }
  if (local_c0 != (Pipeline *)0x0) {
    (*(code *)local_c0)(local_e8 + 0x18,local_e8 + 0x18,3);
    _Var4._M_pi = extraout_RDX_05;
  }
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
    _Var4._M_pi = extraout_RDX_06;
  }
  if (local_f8 != (code *)0x0) {
    (*local_f8)(&local_108,&local_108,__destroy_functor);
    _Var4._M_pi = extraout_RDX_07;
  }
  _Var5._M_refcount._M_pi = _Var4._M_pi;
  _Var5._M_ptr = local_38;
  if (local_38 != (element_type *)0x0) {
    _Var5 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>)
            (*(code *)local_38)(&local_48,&local_48,3);
  }
  return (BaseHandle)(BaseHandle)_Var5;
}

Assistant:

static QPDFObjectHandle
qpdf_oh_item_internal(qpdf_data qpdf, qpdf_oh item)
{
    return do_with_oh<QPDFObjectHandle>(
        qpdf,
        item,
        []() { return QPDFObjectHandle::newNull(); },
        [](QPDFObjectHandle& o) { return o; });
}